

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int exprMightBeIndexed2(SrcList *pFrom,Bitmask mPrereq,int *aiCurCol,Expr *pExpr)

{
  int iTab;
  bool bVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  Index *pIVar5;
  
  lVar3 = 0;
  if (1 < mPrereq) {
    do {
      lVar3 = lVar3 + 1;
      bVar1 = 3 < mPrereq;
      mPrereq = mPrereq >> 1;
    } while (bVar1);
  }
  pIVar5 = (pFrom->a[lVar3].pTab)->pIndex;
  if (pIVar5 != (Index *)0x0) {
    iTab = pFrom->a[lVar3].iCursor;
    do {
      if ((pIVar5->aColExpr != (ExprList *)0x0) && (pIVar5->nKeyCol != 0)) {
        lVar3 = 4;
        uVar4 = 0;
        do {
          if ((pIVar5->aiColumn[uVar4] == -2) &&
             (iVar2 = sqlite3ExprCompareSkip
                                (pExpr,*(Expr **)((long)pIVar5->aColExpr->a + lVar3 * 2 + -8),iTab),
             iVar2 == 0)) {
            *aiCurCol = iTab;
            aiCurCol[1] = -2;
            return 1;
          }
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar4 < pIVar5->nKeyCol);
      }
      pIVar5 = pIVar5->pNext;
    } while (pIVar5 != (Index *)0x0);
  }
  return 0;
}

Assistant:

static SQLITE_NOINLINE int exprMightBeIndexed2(
  SrcList *pFrom,        /* The FROM clause */
  Bitmask mPrereq,       /* Bitmask of FROM clause terms referenced by pExpr */
  int *aiCurCol,         /* Write the referenced table cursor and column here */
  Expr *pExpr            /* An operand of a comparison operator */
){
  Index *pIdx;
  int i;
  int iCur;
  for(i=0; mPrereq>1; i++, mPrereq>>=1){}
  iCur = pFrom->a[i].iCursor;
  for(pIdx=pFrom->a[i].pTab->pIndex; pIdx; pIdx=pIdx->pNext){
    if( pIdx->aColExpr==0 ) continue;
    for(i=0; i<pIdx->nKeyCol; i++){
      if( pIdx->aiColumn[i]!=XN_EXPR ) continue;
      if( sqlite3ExprCompareSkip(pExpr, pIdx->aColExpr->a[i].pExpr, iCur)==0 ){
        aiCurCol[0] = iCur;
        aiCurCol[1] = XN_EXPR;
        return 1;
      }
    }
  }
  return 0;
}